

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

BadType * __thiscall camp::BadType::typeName_abi_cxx11_(BadType *this,Type type)

{
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  Type local_14;
  BadType *pBStack_10;
  Type type_local;
  
  local_14 = type;
  pBStack_10 = this;
  switch(type) {
  case noType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"none",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case boolType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"boolean",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case intType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"integer",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case realType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"real",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case stringType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"string",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case enumType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"enum",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case arrayType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"array",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case userType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"user",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"unknown",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  }
  return this;
}

Assistant:

std::string BadType::typeName(Type type)
{
    switch (type)
    {
        case noType:     return "none";
        case boolType:   return "boolean";
        case intType:    return "integer";
        case realType:   return "real";
        case stringType: return "string";
        case enumType:   return "enum";
        case arrayType:  return "array";
        case userType:   return "user";
        default:         return "unknown";
    }
}